

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

int __thiscall spdlog::details::registry::shutdown(registry *this,int __fd,int __how)

{
  int iVar1;
  
  std::mutex::lock(&this->flusher_mutex_);
  std::
  __uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::reset((__uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
           *)&this->periodic_flusher_,(pointer)0x0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->flusher_mutex_);
  drop_all(this);
  std::recursive_mutex::lock(&this->tp_mutex_);
  std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->tp_).
              super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>);
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->tp_mutex_);
  return iVar1;
}

Assistant:

SPDLOG_INLINE void registry::shutdown()
{
    {
        std::lock_guard<std::mutex> lock(flusher_mutex_);
        periodic_flusher_.reset();
    }

    drop_all();

    {
        std::lock_guard<std::recursive_mutex> lock(tp_mutex_);
        tp_.reset();
    }
}